

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_string.cpp
# Opt level: O0

string * duckdb::StandardStringCast<duckdb::hugeint_t>(hugeint_t input)

{
  hugeint_t input_00;
  string *in_RDI;
  anon_union_16_2_67f50693_for_value aVar1;
  Vector v;
  Vector *in_stack_ffffffffffffff10;
  uint64_t in_stack_ffffffffffffff18;
  string *psVar2;
  idx_t in_stack_ffffffffffffff40;
  LogicalType *in_stack_ffffffffffffff48;
  Vector *in_stack_ffffffffffffff50;
  LogicalType aLStack_98 [6];
  
  psVar2 = in_RDI;
  LogicalType::LogicalType(aLStack_98,(LogicalTypeId)((ulong)in_RDI >> 0x38));
  Vector::Vector(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  LogicalType::~LogicalType((LogicalType *)0x2b1da30);
  input_00.upper = (int64_t)in_RDI;
  input_00.lower = in_stack_ffffffffffffff18;
  aVar1.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       StringCast::Operation<duckdb::hugeint_t>(input_00,in_stack_ffffffffffffff10);
  string_t::GetString(aVar1._0_8_);
  Vector::~Vector((Vector *)aVar1.pointer.ptr);
  return psVar2;
}

Assistant:

string StandardStringCast(T input) {
	Vector v(LogicalType::VARCHAR);
	return StringCast::Operation(input, v).GetString();
}